

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

ON_Linetype * __thiscall ON_Linetype::operator=(ON_Linetype *this,ON_Linetype *other)

{
  ON_LinetypePrivate *src;
  ON_LinetypePrivate *this_00;
  
  if (this != other) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&other->super_ON_ModelComponent);
    this->m_is_set_bits = other->m_is_set_bits;
    this->m_is_locked_bits = other->m_is_locked_bits;
    this->m_cap_style = other->m_cap_style;
    this->m_join_style = other->m_join_style;
    this->m_width = other->m_width;
    this->m_width_units = other->m_width_units;
    src = other->m_private;
    this_00 = this->m_private;
    ON_SimpleArray<ON_LinetypeSegment>::operator=(&this_00->m_segments,&src->m_segments);
    ON_SimpleArray<ON_2dPoint>::operator=(&this_00->m_taper_points,&src->m_taper_points);
    this_00->m_always_model_distances = src->m_always_model_distances;
  }
  return this;
}

Assistant:

ON_Linetype& ON_Linetype::operator=(const ON_Linetype& other)
{
  if (this != &other)
  {
    ON_ModelComponent::operator=(other);
    m_is_set_bits = other.m_is_set_bits;
    m_is_locked_bits = other.m_is_locked_bits;
    m_cap_style = other.m_cap_style;
    m_join_style = other.m_join_style;
    m_width = other.m_width;
    m_width_units = other.m_width_units;
    *m_private = *other.m_private;
  }
  return *this;
}